

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
ShowRulesIRCCommand::trigger
          (ShowRulesIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  undefined8 uVar1;
  byte bVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  __sv_type _Var8;
  size_t local_d8;
  char *local_d0;
  size_t local_b8;
  char *local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  undefined8 local_98;
  Server *server;
  uint local_7c;
  undefined1 local_78 [4];
  uint i;
  string msg;
  int type;
  Channel *chan;
  IRC_Bot *source_local;
  ShowRulesIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  lVar4 = Jupiter::IRC::Client::getChannel(source,channel._M_len,channel._M_str);
  if (lVar4 != 0) {
    msg.field_2._12_4_ = Jupiter::IRC::Client::Channel::getType();
    std::__cxx11::string::string((string *)local_78);
    local_7c = 0;
    while( true ) {
      uVar6 = (ulong)local_7c;
      RenX::getCore();
      uVar5 = RenX::Core::getServerCount();
      if (uVar6 == uVar5) break;
      uVar6 = RenX::getCore();
      local_98 = RenX::Core::getServer(uVar6);
      bVar2 = RenX::Server::isLogChanType((int)local_98);
      if ((bVar2 & 1) != 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                   "Rules: ");
        bVar7 = (basic_string_view<char,_std::char_traits<char>_>)RenX::Server::getRules();
        local_a8 = bVar7;
        std::__cxx11::string::operator+=((string *)local_78,&local_a8);
        uVar1 = local_98;
        _Var8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_78);
        local_b8 = _Var8._M_len;
        local_b0 = _Var8._M_str;
        RenX::Server::sendMessage(uVar1,local_b8,local_b0);
      }
      local_7c = local_7c + 1;
    }
    bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                      );
    if (bVar3) {
      bVar7 = sv("Error: Channel not attached to any connected Renegade X servers.",0x40);
      local_d8 = bVar7._M_len;
      local_d0 = bVar7._M_str;
      Jupiter::IRC::Client::sendMessage(source,channel._M_len,channel._M_str,local_d8,local_d0);
    }
    std::__cxx11::string::~string((string *)local_78);
  }
  return;
}

Assistant:

void ShowRulesIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan != nullptr)
	{
		int type = chan->getType();
		std::string msg;
		for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
		{
			RenX::Server *server = RenX::getCore()->getServer(i);
			if (server->isLogChanType(type))
			{
				msg = "Rules: ";
				msg += server->getRules();
				server->sendMessage(msg);
			}
		}
		if (msg.empty())
			source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
	}
}